

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockableVector.hpp
# Opt level: O2

void __thiscall
LockableVector<int>::LockableVector(LockableVector<int> *this,LockableVector<int> *lv)

{
  allocator_type local_31;
  _Vector_base<int,_std::allocator<int>_> local_30;
  
  (this->vectorMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->vectorMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->vectorMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->vectorMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->dataVector).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->vectorMutex).super___mutex_base._M_mutex.__align = 0;
  (this->dataVector).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->dataVector).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::condition_variable::condition_variable(&this->vectorCV);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_30,
             (long)(lv->dataVector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(lv->dataVector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_31);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->dataVector,&local_30);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

LockableVector (LockableVector &&lv) {
		dataVector	= std::vector<T> (lv.dataVector.size());
	}